

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::semiintersection_end
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *this)

{
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var1;
  iterator_range<const_int_*> *piVar2;
  reference val;
  type tVar3;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  __first;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_const_boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>_>
  front_values;
  compose_fn<burst::apply_fn<std::greater<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  in_stack_ffffffffffffffb8;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_const_boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>_>
  local_40;
  
  piVar2 = (this->m_begin)._M_current;
  _Var1._M_current = piVar2 + this->m_min_items;
  __first._M_current = piVar2 + (this->m_min_items - 1);
  local_40.
  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>_>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_End.super_type.m_iterator._M_current =
       (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
        )(this->m_end)._M_current;
  local_40.
  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>_>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_f.m_impl.super_type.m_initialized = true;
  local_40.
  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>_>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_End.m_f.m_impl.super_type.m_initialized = true;
  local_40.
  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>_>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.super_type.m_iterator._M_current =
       (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
        )(__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
          )_Var1._M_current;
  val = boost::iterator_range_detail::
        iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                  ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    *)__first._M_current);
  tVar3 = boost::range::
          count<boost::range_detail::transformed_range<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::greater<void>>::semiintersection_end()::_lambda(auto:1_const&)_1_,boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>const>,int>
                    (&local_40,val);
  std::
  nth_element<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<std::greater<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            (__first,_Var1._M_current + tVar3 + -1,(this->m_end)._M_current,
             in_stack_ffffffffffffffb8);
  return (outer_range_iterator)(_Var1._M_current + tVar3);
}

Assistant:

outer_range_iterator semiintersection_end ()
        {
            auto candidate = semiintersection_candidate();

            auto front_values =
                boost::make_iterator_range(std::next(candidate), m_end)
                    | boost::adaptors::transformed([] (const auto & range)
                        {
                            return range.front();
                        });

            auto last_equal_to_candidate = candidate + boost::count(front_values, candidate->front());
            std::nth_element(candidate, last_equal_to_candidate, m_end, each(front) | m_compare);

            return std::next(last_equal_to_candidate);
        }